

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcwrite.c
# Opt level: O0

int lj_bcwrite(lua_State *L,GCproto *pt,lua_Writer writer,void *data,int strip)

{
  undefined8 *puVar1;
  ulong uVar2;
  int local_ac;
  undefined8 uStack_a8;
  int status;
  BCWriteCtx ctx;
  int strip_local;
  void *data_local;
  lua_Writer writer_local;
  GCproto *pt_local;
  lua_State *L_local;
  
  ctx.wdata._4_4_ = 0;
  ctx.sb.e = (char *)0x0;
  ctx.sb.w = (char *)0x0;
  uStack_a8 = 0;
  ctx.sb.b = (char *)L;
  ctx.sb.L.ptr64 = (uint64_t)pt;
  ctx.pt = (GCproto *)writer;
  ctx.wfunc = (lua_Writer)data;
  ctx.wdata._0_4_ = strip;
  ctx.status = strip;
  local_ac = lj_vm_cpcall(L,0,&stack0xffffffffffffff58,cpwriter);
  if (local_ac == 0) {
    local_ac = ctx.wdata._4_4_;
  }
  puVar1 = *(undefined8 **)(((ulong)ctx.sb.b & 0xfffffffffffffff8) + 0x10);
  uVar2 = (ulong)(uint)((int)ctx.sb.w - (int)ctx.sb.e);
  puVar1[2] = puVar1[2] - uVar2;
  (*(code *)*puVar1)(puVar1[1],ctx.sb.e,uVar2,0);
  return local_ac;
}

Assistant:

int lj_bcwrite(lua_State *L, GCproto *pt, lua_Writer writer, void *data,
	      int strip)
{
  BCWriteCtx ctx;
  int status;
  ctx.pt = pt;
  ctx.wfunc = writer;
  ctx.wdata = data;
  ctx.strip = strip;
  ctx.status = 0;
#ifdef LUA_USE_ASSERT
  ctx.g = G(L);
#endif
  lj_buf_init(L, &ctx.sb);
  status = lj_vm_cpcall(L, NULL, &ctx, cpwriter);
  if (status == 0) status = ctx.status;
  lj_buf_free(G(sbufL(&ctx.sb)), &ctx.sb);
  return status;
}